

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderValidatePush(xmlTextReaderPtr reader)

{
  int *piVar1;
  xmlParserCtxtPtr pxVar2;
  uint uVar3;
  xmlTextReaderValidate xVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlNodePtr pxVar7;
  xmlChar buf [50];
  
  pxVar7 = reader->node;
  xVar4 = reader->validate;
  if (xVar4 == XML_TEXTREADER_VALIDATE_DTD) {
    pxVar2 = reader->ctxt;
    if ((pxVar2 != (xmlParserCtxtPtr)0x0) && (pxVar2->validate == 1)) {
      if ((pxVar7->ns == (xmlNs *)0x0) || (pxVar6 = pxVar7->ns->prefix, pxVar6 == (xmlChar *)0x0)) {
        uVar3 = xmlValidatePushElement(&pxVar2->vctxt,pxVar2->myDoc,pxVar7,pxVar7->name);
        piVar1 = &reader->ctxt->valid;
        *piVar1 = *piVar1 & uVar3;
      }
      else {
        pxVar6 = xmlBuildQName(pxVar7->name,pxVar6,buf,0x32);
        if (pxVar6 == (xmlChar *)0x0) {
          xmlTextReaderErrMemory(reader);
          return -1;
        }
        uVar3 = xmlValidatePushElement(&reader->ctxt->vctxt,reader->ctxt->myDoc,pxVar7,pxVar6);
        piVar1 = &reader->ctxt->valid;
        *piVar1 = *piVar1 & uVar3;
        if (pxVar6 != buf) {
          (*xmlFree)(pxVar6);
        }
      }
    }
    xVar4 = reader->validate;
  }
  if (xVar4 != XML_TEXTREADER_VALIDATE_RNG) {
    return 0;
  }
  if (reader->rngValidCtxt == (xmlRelaxNGValidCtxtPtr)0x0) {
    return 0;
  }
  if (reader->rngFullNode != (xmlNodePtr)0x0) {
    return 0;
  }
  iVar5 = xmlRelaxNGValidatePushElement(reader->rngValidCtxt,reader->ctxt->myDoc,pxVar7);
  if (iVar5 == 0) {
    pxVar7 = xmlTextReaderExpand(reader);
    if (pxVar7 == (xmlNodePtr)0x0) goto LAB_0016d833;
    iVar5 = xmlRelaxNGValidateFullElement(reader->rngValidCtxt,reader->ctxt->myDoc,pxVar7);
    reader->rngFullNode = pxVar7;
  }
  if (iVar5 == 1) {
    return 0;
  }
LAB_0016d833:
  reader->rngValidErrors = reader->rngValidErrors + 1;
  return 0;
}

Assistant:

static int
xmlTextReaderValidatePush(xmlTextReaderPtr reader) {
    xmlNodePtr node = reader->node;

#ifdef LIBXML_VALID_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_DTD) &&
        (reader->ctxt != NULL) && (reader->ctxt->validate == 1)) {
	if ((node->ns == NULL) || (node->ns->prefix == NULL)) {
	    reader->ctxt->valid &= xmlValidatePushElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, node->name);
	} else {
            xmlChar buf[50];
	    xmlChar *qname;

	    qname = xmlBuildQName(node->name, node->ns->prefix, buf, 50);
            if (qname == NULL) {
                xmlTextReaderErrMemory(reader);
                return(-1);
            }
	    reader->ctxt->valid &= xmlValidatePushElement(&reader->ctxt->vctxt,
				    reader->ctxt->myDoc, node, qname);
            if (qname != buf)
	        xmlFree(qname);
	}
        /*if (reader->ctxt->errNo == XML_ERR_NO_MEMORY) {
            reader->mode = XML_TEXTREADER_MODE_ERROR;
            reader->state = XML_TEXTREADER_ERROR;
            return(-1);
        }*/
    }
#endif /* LIBXML_VALID_ENABLED */
#ifdef LIBXML_RELAXNG_ENABLED
    if ((reader->validate == XML_TEXTREADER_VALIDATE_RNG) &&
               (reader->rngValidCtxt != NULL)) {
	int ret;

	if (reader->rngFullNode != NULL) return(0);
	ret = xmlRelaxNGValidatePushElement(reader->rngValidCtxt,
	                                    reader->ctxt->myDoc,
					    node);
	if (ret == 0) {
	    /*
	     * this element requires a full tree
	     */
	    node = xmlTextReaderExpand(reader);
	    if (node == NULL) {
	        ret = -1;
	    } else {
		ret = xmlRelaxNGValidateFullElement(reader->rngValidCtxt,
						    reader->ctxt->myDoc,
						    node);
		reader->rngFullNode = node;
	    }
	}
	if (ret != 1)
	    reader->rngValidErrors++;
    }
#endif

    return(0);
}